

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastIntrinsics.h
# Opt level: O3

void NFastOps::TanhAvx2<false,true>(double *from,size_t size,double *to)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  
  uVar2 = size * 8 & 0xffffffffffffff80;
  if (uVar2 != 0) {
    uVar3 = 0;
    auVar45._8_8_ = 0x4090000000000000;
    auVar45._0_8_ = 0x4090000000000000;
    auVar45._16_8_ = 0x4090000000000000;
    auVar45._24_8_ = 0x4090000000000000;
    auVar30._8_8_ = 0xc08ff80000000000;
    auVar30._0_8_ = 0xc08ff80000000000;
    auVar30._16_8_ = 0xc08ff80000000000;
    auVar30._24_8_ = 0xc08ff80000000000;
    auVar43._8_8_ = 0xbfd3a55c9a802161;
    auVar43._0_8_ = 0xbfd3a55c9a802161;
    auVar43._16_8_ = 0xbfd3a55c9a802161;
    auVar43._24_8_ = 0xbfd3a55c9a802161;
    auVar48._8_8_ = 0xbfb0ca61fe455ffa;
    auVar48._0_8_ = 0xbfb0ca61fe455ffa;
    auVar48._16_8_ = 0xbfb0ca61fe455ffa;
    auVar48._24_8_ = 0xbfb0ca61fe455ffa;
    auVar49._8_8_ = 0xbf8bc31d985ef88c;
    auVar49._0_8_ = 0xbf8bc31d985ef88c;
    auVar49._16_8_ = 0xbf8bc31d985ef88c;
    auVar49._24_8_ = 0xbf8bc31d985ef88c;
    auVar53._8_8_ = 0x4000000000000000;
    auVar53._0_8_ = 0x4000000000000000;
    auVar53._16_8_ = 0x4000000000000000;
    auVar53._24_8_ = 0x4000000000000000;
    do {
      pdVar4 = (double *)((long)from + uVar3);
      auVar68._0_8_ = *pdVar4 * -2.8853900817779268;
      auVar68._8_8_ = pdVar4[1] * -2.8853900817779268;
      auVar68._16_8_ = pdVar4[2] * -2.8853900817779268;
      auVar68._24_8_ = pdVar4[3] * -2.8853900817779268;
      auVar68 = vminpd_avx(auVar68,auVar45);
      auVar68 = vmaxpd_avx(auVar68,auVar30);
      auVar55 = vroundpd_avx(auVar68,1);
      auVar68 = vsubpd_avx(auVar68,auVar55);
      auVar67._0_8_ = auVar55._0_8_ + 6755399441055744.0;
      auVar67._8_8_ = auVar55._8_8_ + 6755399441055744.0;
      auVar67._16_8_ = auVar55._16_8_ + 6755399441055744.0;
      auVar67._24_8_ = auVar55._24_8_ + 6755399441055744.0;
      auVar72._0_8_ = auVar68._0_8_ * auVar68._0_8_;
      auVar72._8_8_ = auVar68._8_8_ * auVar68._8_8_;
      auVar72._16_8_ = auVar68._16_8_ * auVar68._16_8_;
      auVar72._24_8_ = auVar68._24_8_ * auVar68._24_8_;
      auVar17 = vfmadd213pd_fma(auVar48,auVar68,auVar43);
      auVar17 = vfmadd231pd_fma(ZEXT1632(auVar17),auVar72,auVar49);
      auVar55 = vsubpd_avx(auVar68,auVar72);
      auVar17 = vfmadd213pd_fma(auVar55,ZEXT1632(auVar17),auVar68);
      auVar55._0_8_ = auVar17._0_8_ + 1.0;
      auVar55._8_8_ = auVar17._8_8_ + 1.0;
      auVar55._16_8_ = 0x3ff0000000000000;
      auVar55._24_8_ = 0x3ff0000000000000;
      auVar68 = vpsllq_avx2(auVar67,0x34);
      auVar68 = vpaddq_avx2(auVar68,auVar55);
      auVar56._0_8_ = auVar68._0_8_ + 1.0;
      auVar56._8_8_ = auVar68._8_8_ + 1.0;
      auVar56._16_8_ = auVar68._16_8_ + 1.0;
      auVar56._24_8_ = auVar68._24_8_ + 1.0;
      auVar68 = vdivpd_avx(auVar53,auVar56);
      pdVar4 = (double *)((long)to + uVar3);
      *pdVar4 = auVar68._0_8_ + -1.0;
      pdVar4[1] = auVar68._8_8_ + -1.0;
      pdVar4[2] = auVar68._16_8_ + -1.0;
      pdVar4[3] = auVar68._24_8_ + -1.0;
      pdVar4 = (double *)((long)from + uVar3 + 0x20);
      auVar57._0_8_ = *pdVar4 * -2.8853900817779268;
      auVar57._8_8_ = pdVar4[1] * -2.8853900817779268;
      auVar57._16_8_ = pdVar4[2] * -2.8853900817779268;
      auVar57._24_8_ = pdVar4[3] * -2.8853900817779268;
      auVar68 = vminpd_avx(auVar57,auVar45);
      auVar68 = vmaxpd_avx(auVar68,auVar30);
      auVar55 = vroundpd_avx(auVar68,1);
      auVar68 = vsubpd_avx(auVar68,auVar55);
      auVar69._0_8_ = auVar55._0_8_ + 6755399441055744.0;
      auVar69._8_8_ = auVar55._8_8_ + 6755399441055744.0;
      auVar69._16_8_ = auVar55._16_8_ + 6755399441055744.0;
      auVar69._24_8_ = auVar55._24_8_ + 6755399441055744.0;
      auVar73._0_8_ = auVar68._0_8_ * auVar68._0_8_;
      auVar73._8_8_ = auVar68._8_8_ * auVar68._8_8_;
      auVar73._16_8_ = auVar68._16_8_ * auVar68._16_8_;
      auVar73._24_8_ = auVar68._24_8_ * auVar68._24_8_;
      auVar17 = vfmadd213pd_fma(auVar48,auVar68,auVar43);
      auVar17 = vfmadd231pd_fma(ZEXT1632(auVar17),auVar73,auVar49);
      auVar55 = vsubpd_avx(auVar68,auVar73);
      auVar17 = vfmadd213pd_fma(auVar55,ZEXT1632(auVar17),auVar68);
      auVar58._0_8_ = auVar17._0_8_ + 1.0;
      auVar58._8_8_ = auVar17._8_8_ + 1.0;
      auVar58._16_8_ = 0x3ff0000000000000;
      auVar58._24_8_ = 0x3ff0000000000000;
      auVar68 = vpsllq_avx2(auVar69,0x34);
      auVar68 = vpaddq_avx2(auVar68,auVar58);
      auVar59._0_8_ = auVar68._0_8_ + 1.0;
      auVar59._8_8_ = auVar68._8_8_ + 1.0;
      auVar59._16_8_ = auVar68._16_8_ + 1.0;
      auVar59._24_8_ = auVar68._24_8_ + 1.0;
      auVar68 = vdivpd_avx(auVar53,auVar59);
      pdVar4 = (double *)((long)to + uVar3 + 0x20);
      *pdVar4 = auVar68._0_8_ + -1.0;
      pdVar4[1] = auVar68._8_8_ + -1.0;
      pdVar4[2] = auVar68._16_8_ + -1.0;
      pdVar4[3] = auVar68._24_8_ + -1.0;
      pdVar4 = (double *)((long)from + uVar3 + 0x40);
      auVar60._0_8_ = *pdVar4 * -2.8853900817779268;
      auVar60._8_8_ = pdVar4[1] * -2.8853900817779268;
      auVar60._16_8_ = pdVar4[2] * -2.8853900817779268;
      auVar60._24_8_ = pdVar4[3] * -2.8853900817779268;
      auVar68 = vminpd_avx(auVar60,auVar45);
      auVar68 = vmaxpd_avx(auVar68,auVar30);
      auVar55 = vroundpd_avx(auVar68,1);
      auVar68 = vsubpd_avx(auVar68,auVar55);
      auVar70._0_8_ = auVar55._0_8_ + 6755399441055744.0;
      auVar70._8_8_ = auVar55._8_8_ + 6755399441055744.0;
      auVar70._16_8_ = auVar55._16_8_ + 6755399441055744.0;
      auVar70._24_8_ = auVar55._24_8_ + 6755399441055744.0;
      auVar74._0_8_ = auVar68._0_8_ * auVar68._0_8_;
      auVar74._8_8_ = auVar68._8_8_ * auVar68._8_8_;
      auVar74._16_8_ = auVar68._16_8_ * auVar68._16_8_;
      auVar74._24_8_ = auVar68._24_8_ * auVar68._24_8_;
      auVar17 = vfmadd213pd_fma(auVar48,auVar68,auVar43);
      auVar17 = vfmadd231pd_fma(ZEXT1632(auVar17),auVar74,auVar49);
      auVar55 = vsubpd_avx(auVar68,auVar74);
      auVar17 = vfmadd213pd_fma(auVar55,ZEXT1632(auVar17),auVar68);
      auVar61._0_8_ = auVar17._0_8_ + 1.0;
      auVar61._8_8_ = auVar17._8_8_ + 1.0;
      auVar61._16_8_ = 0x3ff0000000000000;
      auVar61._24_8_ = 0x3ff0000000000000;
      auVar68 = vpsllq_avx2(auVar70,0x34);
      auVar68 = vpaddq_avx2(auVar68,auVar61);
      auVar62._0_8_ = auVar68._0_8_ + 1.0;
      auVar62._8_8_ = auVar68._8_8_ + 1.0;
      auVar62._16_8_ = auVar68._16_8_ + 1.0;
      auVar62._24_8_ = auVar68._24_8_ + 1.0;
      auVar68 = vdivpd_avx(auVar53,auVar62);
      pdVar4 = (double *)((long)to + uVar3 + 0x40);
      *pdVar4 = auVar68._0_8_ + -1.0;
      pdVar4[1] = auVar68._8_8_ + -1.0;
      pdVar4[2] = auVar68._16_8_ + -1.0;
      pdVar4[3] = auVar68._24_8_ + -1.0;
      pdVar4 = (double *)((long)from + uVar3 + 0x60);
      auVar63._0_8_ = *pdVar4 * -2.8853900817779268;
      auVar63._8_8_ = pdVar4[1] * -2.8853900817779268;
      auVar63._16_8_ = pdVar4[2] * -2.8853900817779268;
      auVar63._24_8_ = pdVar4[3] * -2.8853900817779268;
      auVar68 = vminpd_avx(auVar63,auVar45);
      auVar68 = vmaxpd_avx(auVar68,auVar30);
      auVar55 = vroundpd_avx(auVar68,1);
      auVar68 = vsubpd_avx(auVar68,auVar55);
      auVar71._0_8_ = auVar55._0_8_ + 6755399441055744.0;
      auVar71._8_8_ = auVar55._8_8_ + 6755399441055744.0;
      auVar71._16_8_ = auVar55._16_8_ + 6755399441055744.0;
      auVar71._24_8_ = auVar55._24_8_ + 6755399441055744.0;
      auVar75._0_8_ = auVar68._0_8_ * auVar68._0_8_;
      auVar75._8_8_ = auVar68._8_8_ * auVar68._8_8_;
      auVar75._16_8_ = auVar68._16_8_ * auVar68._16_8_;
      auVar75._24_8_ = auVar68._24_8_ * auVar68._24_8_;
      auVar17 = vfmadd213pd_fma(auVar48,auVar68,auVar43);
      auVar17 = vfmadd231pd_fma(ZEXT1632(auVar17),auVar75,auVar49);
      auVar55 = vsubpd_avx(auVar68,auVar75);
      auVar17 = vfmadd213pd_fma(auVar55,ZEXT1632(auVar17),auVar68);
      auVar64._0_8_ = auVar17._0_8_ + 1.0;
      auVar64._8_8_ = auVar17._8_8_ + 1.0;
      auVar64._16_8_ = 0x3ff0000000000000;
      auVar64._24_8_ = 0x3ff0000000000000;
      auVar68 = vpsllq_avx2(auVar71,0x34);
      auVar68 = vpaddq_avx2(auVar68,auVar64);
      auVar65._0_8_ = auVar68._0_8_ + 1.0;
      auVar65._8_8_ = auVar68._8_8_ + 1.0;
      auVar65._16_8_ = auVar68._16_8_ + 1.0;
      auVar65._24_8_ = auVar68._24_8_ + 1.0;
      auVar68 = vdivpd_avx(auVar53,auVar65);
      pdVar4 = (double *)((long)to + uVar3 + 0x60);
      *pdVar4 = auVar68._0_8_ + -1.0;
      pdVar4[1] = auVar68._8_8_ + -1.0;
      pdVar4[2] = auVar68._16_8_ + -1.0;
      pdVar4[3] = auVar68._24_8_ + -1.0;
      uVar3 = uVar3 + 0x80;
    } while (uVar3 < uVar2);
  }
  pdVar5 = (double *)((long)from + uVar2);
  pdVar4 = (double *)((long)to + uVar2);
  if ((size & 8) != 0) {
    auVar8._0_8_ = *pdVar5 * -2.8853900817779268;
    auVar8._8_8_ = pdVar5[1] * -2.8853900817779268;
    auVar8._16_8_ = pdVar5[2] * -2.8853900817779268;
    auVar8._24_8_ = pdVar5[3] * -2.8853900817779268;
    auVar31._8_8_ = 0x4090000000000000;
    auVar31._0_8_ = 0x4090000000000000;
    auVar31._16_8_ = 0x4090000000000000;
    auVar31._24_8_ = 0x4090000000000000;
    auVar45 = vminpd_avx(auVar8,auVar31);
    auVar39._8_8_ = 0xc08ff80000000000;
    auVar39._0_8_ = 0xc08ff80000000000;
    auVar39._16_8_ = 0xc08ff80000000000;
    auVar39._24_8_ = 0xc08ff80000000000;
    auVar45 = vmaxpd_avx(auVar45,auVar39);
    auVar30 = vroundpd_avx(auVar45,1);
    auVar45 = vsubpd_avx(auVar45,auVar30);
    auVar44._0_8_ = auVar30._0_8_ + 6755399441055744.0;
    auVar44._8_8_ = auVar30._8_8_ + 6755399441055744.0;
    auVar44._16_8_ = auVar30._16_8_ + 6755399441055744.0;
    auVar44._24_8_ = auVar30._24_8_ + 6755399441055744.0;
    auVar50._0_8_ = auVar45._0_8_ * auVar45._0_8_;
    auVar50._8_8_ = auVar45._8_8_ * auVar45._8_8_;
    auVar50._16_8_ = auVar45._16_8_ * auVar45._16_8_;
    auVar50._24_8_ = auVar45._24_8_ * auVar45._24_8_;
    auVar54._8_8_ = 0xbfd3a55c9a802161;
    auVar54._0_8_ = 0xbfd3a55c9a802161;
    auVar54._16_8_ = 0xbfd3a55c9a802161;
    auVar54._24_8_ = 0xbfd3a55c9a802161;
    auVar9._8_8_ = 0xbfb0ca61fe455ffa;
    auVar9._0_8_ = 0xbfb0ca61fe455ffa;
    auVar9._16_8_ = 0xbfb0ca61fe455ffa;
    auVar9._24_8_ = 0xbfb0ca61fe455ffa;
    auVar17 = vfmadd213pd_fma(auVar9,auVar45,auVar54);
    auVar66._8_8_ = 0xbf8bc31d985ef88c;
    auVar66._0_8_ = 0xbf8bc31d985ef88c;
    auVar66._16_8_ = 0xbf8bc31d985ef88c;
    auVar66._24_8_ = 0xbf8bc31d985ef88c;
    auVar17 = vfmadd231pd_fma(ZEXT1632(auVar17),auVar50,auVar66);
    auVar30 = vsubpd_avx(auVar45,auVar50);
    auVar17 = vfmadd213pd_fma(auVar30,ZEXT1632(auVar17),auVar45);
    auVar51._0_8_ = auVar17._0_8_ + 1.0;
    auVar51._8_8_ = auVar17._8_8_ + 1.0;
    auVar51._16_8_ = 0x3ff0000000000000;
    auVar51._24_8_ = 0x3ff0000000000000;
    auVar45 = vpsllq_avx2(auVar44,0x34);
    auVar45 = vpaddq_avx2(auVar45,auVar51);
    auVar52._8_8_ = 0x4000000000000000;
    auVar52._0_8_ = 0x4000000000000000;
    auVar52._16_8_ = 0x4000000000000000;
    auVar52._24_8_ = 0x4000000000000000;
    auVar46._0_8_ = auVar45._0_8_ + 1.0;
    auVar46._8_8_ = auVar45._8_8_ + 1.0;
    auVar46._16_8_ = auVar45._16_8_ + 1.0;
    auVar46._24_8_ = auVar45._24_8_ + 1.0;
    auVar45 = vdivpd_avx(auVar52,auVar46);
    *pdVar4 = auVar45._0_8_ + -1.0;
    pdVar4[1] = auVar45._8_8_ + -1.0;
    pdVar4[2] = auVar45._16_8_ + -1.0;
    pdVar4[3] = auVar45._24_8_ + -1.0;
    auVar21._0_8_ = pdVar5[4] * -2.8853900817779268;
    auVar21._8_8_ = pdVar5[5] * -2.8853900817779268;
    auVar21._16_8_ = pdVar5[6] * -2.8853900817779268;
    auVar21._24_8_ = pdVar5[7] * -2.8853900817779268;
    auVar45 = vminpd_avx(auVar21,auVar31);
    auVar45 = vmaxpd_avx(auVar45,auVar39);
    auVar30 = vroundpd_avx(auVar45,1);
    auVar45 = vsubpd_avx(auVar45,auVar30);
    auVar32._0_8_ = auVar30._0_8_ + 6755399441055744.0;
    auVar32._8_8_ = auVar30._8_8_ + 6755399441055744.0;
    auVar32._16_8_ = auVar30._16_8_ + 6755399441055744.0;
    auVar32._24_8_ = auVar30._24_8_ + 6755399441055744.0;
    auVar40._0_8_ = auVar45._0_8_ * auVar45._0_8_;
    auVar40._8_8_ = auVar45._8_8_ * auVar45._8_8_;
    auVar40._16_8_ = auVar45._16_8_ * auVar45._16_8_;
    auVar40._24_8_ = auVar45._24_8_ * auVar45._24_8_;
    auVar17 = vfmadd213pd_fma(auVar9,auVar45,auVar54);
    auVar17 = vfmadd231pd_fma(ZEXT1632(auVar17),auVar40,auVar66);
    auVar30 = vsubpd_avx(auVar45,auVar40);
    auVar17 = vfmadd213pd_fma(auVar30,ZEXT1632(auVar17),auVar45);
    auVar10._0_8_ = auVar17._0_8_ + 1.0;
    auVar10._8_8_ = auVar17._8_8_ + 1.0;
    auVar10._16_8_ = 0x3ff0000000000000;
    auVar10._24_8_ = 0x3ff0000000000000;
    auVar45 = vpsllq_avx2(auVar32,0x34);
    auVar45 = vpaddq_avx2(auVar45,auVar10);
    auVar11._0_8_ = auVar45._0_8_ + 1.0;
    auVar11._8_8_ = auVar45._8_8_ + 1.0;
    auVar11._16_8_ = auVar45._16_8_ + 1.0;
    auVar11._24_8_ = auVar45._24_8_ + 1.0;
    auVar45 = vdivpd_avx(auVar52,auVar11);
    pdVar4[4] = auVar45._0_8_ + -1.0;
    pdVar4[5] = auVar45._8_8_ + -1.0;
    pdVar4[6] = auVar45._16_8_ + -1.0;
    pdVar4[7] = auVar45._24_8_ + -1.0;
    pdVar4 = pdVar4 + 8;
    pdVar5 = pdVar5 + 8;
  }
  if ((size & 4) != 0) {
    auVar12._0_8_ = *pdVar5 * -2.8853900817779268;
    auVar12._8_8_ = pdVar5[1] * -2.8853900817779268;
    auVar12._16_8_ = pdVar5[2] * -2.8853900817779268;
    auVar12._24_8_ = pdVar5[3] * -2.8853900817779268;
    auVar22._8_8_ = 0x4090000000000000;
    auVar22._0_8_ = 0x4090000000000000;
    auVar22._16_8_ = 0x4090000000000000;
    auVar22._24_8_ = 0x4090000000000000;
    auVar45 = vminpd_avx(auVar12,auVar22);
    auVar23._8_8_ = 0xc08ff80000000000;
    auVar23._0_8_ = 0xc08ff80000000000;
    auVar23._16_8_ = 0xc08ff80000000000;
    auVar23._24_8_ = 0xc08ff80000000000;
    auVar45 = vmaxpd_avx(auVar45,auVar23);
    auVar30 = vroundpd_avx(auVar45,1);
    auVar45 = vsubpd_avx(auVar45,auVar30);
    auVar24._0_8_ = auVar30._0_8_ + 6755399441055744.0;
    auVar24._8_8_ = auVar30._8_8_ + 6755399441055744.0;
    auVar24._16_8_ = auVar30._16_8_ + 6755399441055744.0;
    auVar24._24_8_ = auVar30._24_8_ + 6755399441055744.0;
    auVar33._8_8_ = 0xbfd3a55c9a802161;
    auVar33._0_8_ = 0xbfd3a55c9a802161;
    auVar33._16_8_ = 0xbfd3a55c9a802161;
    auVar33._24_8_ = 0xbfd3a55c9a802161;
    auVar41._0_8_ = auVar45._0_8_ * auVar45._0_8_;
    auVar41._8_8_ = auVar45._8_8_ * auVar45._8_8_;
    auVar41._16_8_ = auVar45._16_8_ * auVar45._16_8_;
    auVar41._24_8_ = auVar45._24_8_ * auVar45._24_8_;
    auVar47._8_8_ = 0xbfb0ca61fe455ffa;
    auVar47._0_8_ = 0xbfb0ca61fe455ffa;
    auVar47._16_8_ = 0xbfb0ca61fe455ffa;
    auVar47._24_8_ = 0xbfb0ca61fe455ffa;
    auVar17 = vfmadd213pd_fma(auVar47,auVar45,auVar33);
    auVar34._8_8_ = 0xbf8bc31d985ef88c;
    auVar34._0_8_ = 0xbf8bc31d985ef88c;
    auVar34._16_8_ = 0xbf8bc31d985ef88c;
    auVar34._24_8_ = 0xbf8bc31d985ef88c;
    auVar17 = vfmadd213pd_fma(auVar34,auVar41,ZEXT1632(auVar17));
    auVar30 = vsubpd_avx(auVar45,auVar41);
    auVar17 = vfmadd213pd_fma(auVar30,ZEXT1632(auVar17),auVar45);
    auVar35._0_8_ = auVar17._0_8_ + 1.0;
    auVar35._8_8_ = auVar17._8_8_ + 1.0;
    auVar35._16_8_ = 0x3ff0000000000000;
    auVar35._24_8_ = 0x3ff0000000000000;
    auVar45 = vpsllq_avx2(auVar24,0x34);
    auVar45 = vpaddq_avx2(auVar45,auVar35);
    auVar36._8_8_ = 0x4000000000000000;
    auVar36._0_8_ = 0x4000000000000000;
    auVar36._16_8_ = 0x4000000000000000;
    auVar36._24_8_ = 0x4000000000000000;
    auVar13._0_8_ = auVar45._0_8_ + 1.0;
    auVar13._8_8_ = auVar45._8_8_ + 1.0;
    auVar13._16_8_ = auVar45._16_8_ + 1.0;
    auVar13._24_8_ = auVar45._24_8_ + 1.0;
    auVar45 = vdivpd_avx(auVar36,auVar13);
    *pdVar4 = auVar45._0_8_ + -1.0;
    pdVar4[1] = auVar45._8_8_ + -1.0;
    pdVar4[2] = auVar45._16_8_ + -1.0;
    pdVar4[3] = auVar45._24_8_ + -1.0;
    pdVar4 = pdVar4 + 4;
    pdVar5 = pdVar5 + 4;
  }
  if ((size & 2) != 0) {
    auVar17._0_8_ = *pdVar5 * -2.8853900817779268;
    auVar17._8_8_ = pdVar5[1] * -2.8853900817779268;
    auVar14._8_8_ = 0x4090000000000000;
    auVar14._0_8_ = 0x4090000000000000;
    auVar17 = vminpd_avx(auVar17,auVar14);
    auVar15._8_8_ = 0xc08ff80000000000;
    auVar15._0_8_ = 0xc08ff80000000000;
    auVar17 = vmaxpd_avx(auVar17,auVar15);
    auVar20 = vroundpd_avx(auVar17,1);
    auVar17 = vsubpd_avx(auVar17,auVar20);
    auVar16._0_8_ = auVar20._0_8_ + 6755399441055744.0;
    auVar16._8_8_ = auVar20._8_8_ + 6755399441055744.0;
    auVar25._0_8_ = auVar17._0_8_ * auVar17._0_8_;
    auVar25._8_8_ = auVar17._8_8_ * auVar17._8_8_;
    auVar37._8_8_ = 0xbfd3a55c9a802161;
    auVar37._0_8_ = 0xbfd3a55c9a802161;
    auVar42._8_8_ = 0xbfb0ca61fe455ffa;
    auVar42._0_8_ = 0xbfb0ca61fe455ffa;
    auVar20 = vfmadd213pd_fma(auVar42,auVar17,auVar37);
    auVar38._8_8_ = 0xbf8bc31d985ef88c;
    auVar38._0_8_ = 0xbf8bc31d985ef88c;
    auVar14 = vfmadd213pd_fma(auVar38,auVar25,auVar20);
    auVar20 = vsubpd_avx(auVar17,auVar25);
    auVar17 = vfmadd213pd_fma(auVar20,auVar14,auVar17);
    auVar26._0_8_ = auVar17._0_8_ + 1.0;
    auVar26._8_8_ = auVar17._8_8_ + 1.0;
    auVar17 = vpsllq_avx(auVar16,0x34);
    auVar17 = vpaddq_avx(auVar17,auVar26);
    auVar20._0_8_ = auVar17._0_8_ + 1.0;
    auVar20._8_8_ = auVar17._8_8_ + 1.0;
    auVar18._8_8_ = 0x4000000000000000;
    auVar18._0_8_ = 0x4000000000000000;
    auVar17 = vdivpd_avx(auVar18,auVar20);
    *pdVar4 = auVar17._0_8_ + -1.0;
    pdVar4[1] = auVar17._8_8_ + -1.0;
    pdVar4 = pdVar4 + 2;
    pdVar5 = pdVar5 + 2;
  }
  if ((size & 1) != 0) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *pdVar5 * -2.8853900817779268;
    auVar17 = vminsd_avx(auVar6,ZEXT816(0x4090000000000000));
    auVar17 = vmaxsd_avx(auVar17,ZEXT816(0xc08ff80000000000));
    auVar20 = vroundsd_avx(auVar17,auVar17,1);
    dVar1 = auVar17._0_8_ - auVar20._0_8_;
    auVar19._0_8_ = auVar20._0_8_ + 6755399441055744.0;
    auVar19._8_8_ = auVar20._8_8_ + 6755399441055744.0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar1;
    auVar17 = vfmadd213sd_fma(ZEXT816(0xbfb0ca61fe455ffa),auVar7,ZEXT816(0xbfd3a55c9a802161));
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar1 * dVar1;
    auVar17 = vfmadd231sd_fma(auVar17,auVar27,ZEXT816(0xbf8bc31d985ef88c));
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar1 - dVar1 * dVar1;
    auVar17 = vfmadd213sd_fma(auVar28,auVar17,auVar7);
    auVar20 = vpsllq_avx(auVar19,0x34);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = auVar17._0_8_ + 1.0;
    auVar17 = vpaddq_avx(auVar20,auVar29);
    *pdVar4 = 2.0 / (auVar17._0_8_ + 1.0) + -1.0;
  }
  return;
}

Assistant:

FORCE_INLINE void AVXTanh(const P_Type1& from, size_t size, P_Type2&& to) noexcept {
        AVX_FLOAT_EXP_LIKE_FUNC_CALL((AVXCopy<false, I_OutAligned>), S_Tanh, size * c_elem_size, c::c_neg_2_over_ln_2, c::c_2_f);
    }